

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O1

void PrintBlock(InstructionRegVmLowerGraphContext *ctx,RegVmLoweredModule *lowModule,
               RegVmLoweredBlock *lowblock)

{
  VmBlock *pVVar1;
  char *pcVar2;
  RegVmLoweredInstruction *lowInstruction;
  ulong uVar3;
  
  pVVar1 = lowblock->vmBlock;
  pcVar2 = (pVVar1->name).begin;
  PrintLine(ctx->output,"%.*s.b%d:",(ulong)(uint)(*(int *)&(pVVar1->name).end - (int)pcVar2),pcVar2,
            (ulong)pVVar1->uniqueId);
  if ((lowblock->entryRegisters).count != 0) {
    Print(ctx->output,"  // entry registers: [");
    if ((lowblock->entryRegisters).count != 0) {
      uVar3 = 0;
      do {
        if (uVar3 != 0) {
          Print(ctx->output,", ");
        }
        if ((lowblock->entryRegisters).count <= uVar3) goto LAB_001a9f62;
        Print(ctx->output,"r%d",(ulong)(lowblock->entryRegisters).data[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar3 < (lowblock->entryRegisters).count);
    }
    PrintLine(ctx->output,"]");
  }
  if ((lowblock->reservedRegisters).count != 0) {
    Print(ctx->output,"  // reserved registers: [");
    if ((lowblock->reservedRegisters).count != 0) {
      uVar3 = 0;
      do {
        if (uVar3 != 0) {
          Print(ctx->output,", ");
        }
        if ((lowblock->reservedRegisters).count <= uVar3) goto LAB_001a9f62;
        Print(ctx->output,"r%d",(ulong)(lowblock->reservedRegisters).data[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar3 < (lowblock->reservedRegisters).count);
    }
    PrintLine(ctx->output,"]");
  }
  for (lowInstruction = lowblock->firstInstruction; lowInstruction != (RegVmLoweredInstruction *)0x0
      ; lowInstruction = lowInstruction->nextSibling) {
    OutputContext::Print(ctx->output,"  ",2);
    PrintInstruction(ctx,(char *)(lowModule->constants).data,lowInstruction);
  }
  if ((lowblock->exitRegisters).count != 0) {
    Print(ctx->output,"  // exit registers: [");
    if ((lowblock->exitRegisters).count != 0) {
      uVar3 = 0;
      do {
        if (uVar3 != 0) {
          Print(ctx->output,", ");
        }
        if ((lowblock->exitRegisters).count <= uVar3) {
LAB_001a9f62:
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<unsigned char, 16>::operator[](unsigned int) [T = unsigned char, N = 16]"
                       );
        }
        Print(ctx->output,"r%d",(ulong)(lowblock->exitRegisters).data[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar3 < (lowblock->exitRegisters).count);
    }
    PrintLine(ctx->output,"]");
  }
  if ((lowblock->lastInstruction != (RegVmLoweredInstruction *)0x0) &&
     ((uVar3 = (ulong)lowblock->lastInstruction->code, 0x22 < uVar3 ||
      ((0x4e0000000U >> (uVar3 & 0x3f) & 1) == 0)))) {
    PrintLine(ctx->output,"  // fallthrough");
  }
  OutputContext::Print(ctx->output,"\n",1);
  return;
}

Assistant:

void PrintBlock(InstructionRegVmLowerGraphContext &ctx, RegVmLoweredModule *lowModule, RegVmLoweredBlock *lowblock)
{
	PrintLine(ctx.output, "%.*s.b%d:", FMT_ISTR(lowblock->vmBlock->name), lowblock->vmBlock->uniqueId);

	if(!lowblock->entryRegisters.empty())
	{
		Print(ctx.output, "  // entry registers: [");

		for(unsigned i = 0; i < lowblock->entryRegisters.size(); i++)
		{
			if(i != 0)
				Print(ctx.output, ", ");

			Print(ctx.output, "r%d", lowblock->entryRegisters[i]);
		}

		PrintLine(ctx.output, "]");
	}

	if(!lowblock->reservedRegisters.empty())
	{
		Print(ctx.output, "  // reserved registers: [");

		for(unsigned i = 0; i < lowblock->reservedRegisters.size(); i++)
		{
			if(i != 0)
				Print(ctx.output, ", ");

			Print(ctx.output, "r%d", lowblock->reservedRegisters[i]);
		}

		PrintLine(ctx.output, "]");
	}

	for(RegVmLoweredInstruction *lowInstruction = lowblock->firstInstruction; lowInstruction; lowInstruction = lowInstruction->nextSibling)
	{
		PrintIndent(ctx.output);
		PrintInstruction(ctx, (char*)lowModule->constants.data, lowInstruction);
	}

	if(!lowblock->exitRegisters.empty())
	{
		Print(ctx.output, "  // exit registers: [");

		for(unsigned i = 0; i < lowblock->exitRegisters.size(); i++)
		{
			if(i != 0)
				Print(ctx.output, ", ");

			Print(ctx.output, "r%d", lowblock->exitRegisters[i]);
		}

		PrintLine(ctx.output, "]");
	}

	if(lowblock->lastInstruction && !IsBlockTerminator(lowblock->lastInstruction))
		PrintLine(ctx.output, "  // fallthrough");

	PrintLine(ctx.output);
}